

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_subpixel_8t_intrin_ssse3.c
# Opt level: O3

void aom_scaled_2d_ssse3(uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
                        InterpKernel *filter,int x0_q4,int x_step_q4,int y0_q4,int y_step_q4,int w,
                        int h)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  unkbyte10 Var21;
  undefined1 auVar22 [11];
  undefined1 auVar23 [12];
  undefined1 auVar24 [13];
  undefined1 auVar25 [11];
  undefined1 auVar26 [12];
  undefined1 auVar27 [13];
  undefined1 auVar28 [11];
  undefined1 auVar29 [12];
  undefined1 auVar30 [13];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [14];
  undefined1 auVar36 [12];
  unkbyte10 Var37;
  undefined1 auVar38 [14];
  undefined1 auVar39 [12];
  unkbyte10 Var40;
  undefined1 auVar41 [14];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  int iVar47;
  ulong uVar48;
  uint uVar49;
  ulong *puVar50;
  uint8_t *puVar51;
  ulong *puVar52;
  uint8_t *puVar53;
  uint uVar54;
  uint8_t *puVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  undefined8 *puVar59;
  ulong uVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined4 uVar71;
  undefined1 auVar73 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar109 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined4 uVar121;
  undefined8 uVar122;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar135 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar165 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar208 [16];
  uint8_t temp_1 [64];
  uint8_t temp [9152];
  undefined8 local_2438;
  undefined1 uStack_2430;
  undefined1 uStack_242f;
  undefined1 uStack_242e;
  undefined1 uStack_242d;
  undefined1 uStack_242c;
  undefined1 uStack_242b;
  undefined1 uStack_242a;
  undefined1 uStack_2429;
  undefined8 local_2428;
  undefined1 uStack_2420;
  undefined1 uStack_241f;
  undefined1 uStack_241e;
  undefined1 uStack_241d;
  undefined1 uStack_241c;
  undefined1 uStack_241b;
  undefined1 uStack_241a;
  undefined1 uStack_2419;
  undefined8 local_2418;
  undefined1 uStack_2410;
  undefined1 uStack_240f;
  undefined1 uStack_240e;
  undefined1 uStack_240d;
  undefined1 uStack_240c;
  undefined1 uStack_240b;
  undefined1 uStack_240a;
  undefined1 uStack_2409;
  undefined1 local_2408 [16];
  ulong local_23f8 [8];
  undefined8 uStack_23b8;
  undefined1 auStack_23b0 [56];
  ulong auStack_2378 [8];
  undefined8 uStack_2338;
  undefined1 auStack_2330 [56];
  ulong auStack_22f8 [8];
  undefined8 uStack_22b8;
  undefined1 auStack_22b0 [56];
  ulong auStack_2278 [8];
  undefined8 uStack_2238;
  undefined1 auStack_2230 [8704];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar81 [16];
  undefined1 auVar72 [12];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar87 [16];
  undefined1 auVar86 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar110 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar111 [16];
  undefined1 auVar108 [16];
  undefined1 auVar107 [16];
  undefined1 auVar127 [16];
  undefined1 auVar123 [12];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar140 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar128 [16];
  undefined1 auVar141 [16];
  undefined1 auVar129 [16];
  undefined1 auVar142 [16];
  undefined1 auVar130 [16];
  undefined1 auVar143 [16];
  undefined1 auVar131 [16];
  undefined1 auVar134 [16];
  undefined1 auVar144 [16];
  undefined1 auVar133 [16];
  undefined1 auVar132 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar164 [16];
  undefined1 auVar166 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  
  auVar64 = _DAT_00514bc0;
  auVar63 = _DAT_00514bb0;
  auVar62 = _DAT_00514b80;
  auVar61 = _DAT_00514b60;
  iVar47 = (h + -1) * y_step_q4 + y0_q4 >> 4;
  uVar54 = iVar47 + 8;
  if (w < 8) {
    if (-8 < iVar47) {
      puVar51 = src + src_stride * -3;
      puVar55 = puVar51 + -3;
      iVar47 = 0;
      puVar50 = local_23f8;
      do {
        if (0 < w) {
          lVar58 = 0;
          uVar49 = x0_q4;
          do {
            puVar59 = &local_2438;
            lVar57 = 0;
            do {
              if ((uVar49 & 0xf) == 0) {
                puVar53 = puVar51 + ((int)uVar49 >> 4);
                lVar56 = 0;
                do {
                  *(uint8_t *)((long)puVar59 + lVar56) = *puVar53;
                  lVar56 = lVar56 + 1;
                  puVar53 = puVar53 + src_stride;
                } while (lVar56 != 4);
              }
              else {
                puVar52 = (ulong *)(puVar55 + ((int)uVar49 >> 4));
                auVar101 = *(undefined1 (*) [16])((long)*filter + (ulong)((uVar49 & 0xf) << 4));
                uVar60 = *puVar52;
                uVar122 = *(undefined8 *)((long)puVar52 + src_stride);
                auVar148._8_4_ = 0;
                auVar148._0_8_ = uVar60;
                auVar148._12_2_ = (short)(uVar60 >> 0x30);
                auVar148._14_2_ = (short)((ulong)uVar122 >> 0x30);
                auVar189._12_4_ = auVar148._12_4_;
                auVar189._8_2_ = 0;
                auVar189._0_8_ = uVar60;
                auVar189._10_2_ = (short)((ulong)uVar122 >> 0x20);
                auVar162._10_6_ = auVar189._10_6_;
                auVar162._8_2_ = (short)(uVar60 >> 0x20);
                auVar162._0_8_ = uVar60;
                auVar45._4_8_ = auVar162._8_8_;
                auVar45._2_2_ = (short)((ulong)uVar122 >> 0x10);
                auVar45._0_2_ = (short)(uVar60 >> 0x10);
                auVar188._0_4_ = CONCAT22((short)uVar122,(short)uVar60);
                auVar188._4_12_ = auVar45;
                uVar60 = *(ulong *)((long)puVar52 + src_stride * 2);
                uVar122 = *(undefined8 *)((long)puVar52 + src_stride * 3);
                auVar137._8_4_ = 0;
                auVar137._0_8_ = uVar60;
                auVar137._12_2_ = (short)(uVar60 >> 0x30);
                auVar137._14_2_ = (short)((ulong)uVar122 >> 0x30);
                auVar136._12_4_ = auVar137._12_4_;
                auVar136._8_2_ = 0;
                auVar136._0_8_ = uVar60;
                auVar136._10_2_ = (short)((ulong)uVar122 >> 0x20);
                auVar135._10_6_ = auVar136._10_6_;
                auVar135._8_2_ = (short)(uVar60 >> 0x20);
                auVar135._0_8_ = uVar60;
                auVar46._4_8_ = auVar135._8_8_;
                auVar46._2_2_ = (short)((ulong)uVar122 >> 0x10);
                auVar46._0_2_ = (short)(uVar60 >> 0x10);
                auVar163._6_2_ = (short)uVar122;
                auVar163._4_2_ = (short)uVar60;
                auVar164._0_8_ = auVar188._0_8_;
                auVar164._8_4_ = auVar45._0_4_;
                auVar164._12_4_ = auVar46._0_4_;
                auVar163._8_8_ = auVar164._8_8_;
                auVar163._0_4_ = auVar188._0_4_;
                auVar193._8_8_ = 0;
                auVar193._0_8_ = auVar163._8_8_;
                auVar89._4_4_ = auVar135._8_4_;
                auVar89._0_4_ = auVar162._8_4_;
                auVar89._8_4_ = auVar189._12_4_;
                auVar89._12_4_ = auVar136._12_4_;
                auVar162 = pshufb(auVar101,_DAT_00514b60);
                auVar188 = pshufb(auVar101,ZEXT816(0x604060406040604));
                auVar188 = pmaddubsw(auVar193,auVar188);
                auVar189 = pshufb(auVar101,_DAT_00514b80);
                auVar101 = pshufb(auVar101,ZEXT816(0xe0c0e0c0e0c0e0c));
                auVar101 = pmaddubsw(auVar89 >> 0x40,auVar101);
                auVar138._0_2_ = auVar101._0_2_ + auVar188._0_2_;
                auVar138._2_2_ = auVar101._2_2_ + auVar188._2_2_;
                auVar138._4_2_ = auVar101._4_2_ + auVar188._4_2_;
                auVar138._6_2_ = auVar101._6_2_ + auVar188._6_2_;
                auVar138._8_2_ = auVar101._8_2_ + auVar188._8_2_;
                auVar138._10_2_ = auVar101._10_2_ + auVar188._10_2_;
                auVar138._12_2_ = auVar101._12_2_ + auVar188._12_2_;
                auVar138._14_2_ = auVar101._14_2_ + auVar188._14_2_;
                auVar188 = pmaddubsw(auVar163,auVar162);
                auVar101 = pmaddubsw(auVar89,auVar189);
                auVar90._0_2_ = auVar101._0_2_ + auVar188._0_2_ + 0x40;
                auVar90._2_2_ = auVar101._2_2_ + auVar188._2_2_ + 0x40;
                auVar90._4_2_ = auVar101._4_2_ + auVar188._4_2_ + 0x40;
                auVar90._6_2_ = auVar101._6_2_ + auVar188._6_2_ + 0x40;
                auVar90._8_2_ = auVar101._8_2_ + auVar188._8_2_ + 0x40;
                auVar90._10_2_ = auVar101._10_2_ + auVar188._10_2_ + 0x40;
                auVar90._12_2_ = auVar101._12_2_ + auVar188._12_2_ + 0x40;
                auVar90._14_2_ = auVar101._14_2_ + auVar188._14_2_ + 0x40;
                auVar101 = paddsw(auVar90,auVar138);
                auVar101 = psraw(auVar101,7);
                sVar5 = auVar101._0_2_;
                sVar6 = auVar101._2_2_;
                sVar7 = auVar101._4_2_;
                sVar8 = auVar101._6_2_;
                *(uint *)((long)&local_2438 + lVar57 * 4) =
                     CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar101[6] - (0xff < sVar8),
                              CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar101[4] - (0xff < sVar7),
                                       CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar101[2] -
                                                (0xff < sVar6),
                                                (0 < sVar5) * (sVar5 < 0x100) * auVar101[0] -
                                                (0xff < sVar5))));
              }
              uVar49 = uVar49 + x_step_q4;
              lVar57 = lVar57 + 1;
              puVar59 = (undefined8 *)((long)puVar59 + 4);
            } while (lVar57 != 4);
            auVar101[8] = uStack_2430;
            auVar101._0_8_ = local_2438;
            auVar101[9] = uStack_242f;
            auVar101[10] = uStack_242e;
            auVar101[0xb] = uStack_242d;
            auVar101[0xc] = uStack_242c;
            auVar101[0xd] = uStack_242b;
            auVar101[0xe] = uStack_242a;
            auVar101[0xf] = uStack_2429;
            auVar101 = pshufb(auVar101,_DAT_00514ba0);
            *(int *)((long)puVar50 + lVar58) = auVar101._0_4_;
            *(int *)((long)puVar50 + lVar58 + 0x40) = auVar101._4_4_;
            *(int *)((long)puVar50 + lVar58 + 0x80) = auVar101._8_4_;
            *(int *)((long)puVar50 + lVar58 + 0xc0) = auVar101._12_4_;
            lVar58 = lVar58 + 4;
          } while (lVar58 < w);
        }
        puVar55 = puVar55 + src_stride * 4;
        puVar50 = puVar50 + 0x20;
        iVar47 = iVar47 + 4;
        puVar51 = puVar51 + src_stride * 4;
      } while (iVar47 < (int)uVar54);
    }
  }
  else {
    puVar51 = src + src_stride * -3;
    puVar55 = puVar51 + -3;
    iVar47 = (uVar54 & 0xfffffff8) + 8;
    puVar50 = local_23f8;
    do {
      uVar60 = 0;
      uVar54 = x0_q4;
      do {
        puVar59 = &local_2438;
        lVar58 = 0;
        do {
          if ((uVar54 & 0xf) == 0) {
            puVar53 = puVar51 + ((int)uVar54 >> 4);
            lVar57 = 0;
            do {
              *(uint8_t *)((long)puVar59 + lVar57) = *puVar53;
              lVar57 = lVar57 + 1;
              puVar53 = puVar53 + src_stride;
            } while (lVar57 != 8);
          }
          else {
            puVar52 = (ulong *)(puVar55 + ((int)uVar54 >> 4));
            auVar101 = *(undefined1 (*) [16])((long)*filter + (ulong)((uVar54 & 0xf) << 4));
            uVar48 = *puVar52;
            uVar122 = *(undefined8 *)((long)puVar52 + src_stride);
            auVar76._8_4_ = 0;
            auVar76._0_8_ = uVar48;
            auVar76._12_2_ = (short)(uVar48 >> 0x30);
            auVar76._14_2_ = (short)((ulong)uVar122 >> 0x30);
            auVar75._12_4_ = auVar76._12_4_;
            auVar75._8_2_ = 0;
            auVar75._0_8_ = uVar48;
            auVar75._10_2_ = (short)((ulong)uVar122 >> 0x20);
            auVar74._10_6_ = auVar75._10_6_;
            auVar74._8_2_ = (short)(uVar48 >> 0x20);
            auVar74._0_8_ = uVar48;
            auVar31._4_8_ = auVar74._8_8_;
            auVar31._2_2_ = (short)((ulong)uVar122 >> 0x10);
            auVar31._0_2_ = (short)(uVar48 >> 0x10);
            auVar73._0_4_ = CONCAT22((short)uVar122,(short)uVar48);
            auVar73._4_12_ = auVar31;
            uVar48 = *(ulong *)((long)puVar52 + src_stride * 2);
            uVar122 = *(undefined8 *)((long)puVar52 + src_stride * 3);
            auVar160._8_4_ = 0;
            auVar160._0_8_ = uVar48;
            auVar160._12_2_ = (short)(uVar48 >> 0x30);
            auVar160._14_2_ = (short)((ulong)uVar122 >> 0x30);
            auVar159._12_4_ = auVar160._12_4_;
            auVar159._8_2_ = 0;
            auVar159._0_8_ = uVar48;
            auVar159._10_2_ = (short)((ulong)uVar122 >> 0x20);
            auVar158._10_6_ = auVar159._10_6_;
            auVar158._8_2_ = (short)(uVar48 >> 0x20);
            auVar158._0_8_ = uVar48;
            auVar32._4_8_ = auVar158._8_8_;
            auVar32._2_2_ = (short)((ulong)uVar122 >> 0x10);
            auVar32._0_2_ = (short)(uVar48 >> 0x10);
            auVar161._6_2_ = (short)uVar122;
            auVar161._4_2_ = (short)uVar48;
            uVar48 = *(ulong *)((long)puVar52 + src_stride * 4);
            uVar122 = *(undefined8 *)((long)puVar52 + src_stride * 5);
            auVar186._8_4_ = 0;
            auVar186._0_8_ = uVar48;
            auVar186._12_2_ = (short)(uVar48 >> 0x30);
            auVar186._14_2_ = (short)((ulong)uVar122 >> 0x30);
            auVar185._12_4_ = auVar186._12_4_;
            auVar185._8_2_ = 0;
            auVar185._0_8_ = uVar48;
            auVar185._10_2_ = (short)((ulong)uVar122 >> 0x20);
            auVar184._10_6_ = auVar185._10_6_;
            auVar184._8_2_ = (short)(uVar48 >> 0x20);
            auVar184._0_8_ = uVar48;
            auVar33._4_8_ = auVar184._8_8_;
            auVar33._2_2_ = (short)((ulong)uVar122 >> 0x10);
            auVar33._0_2_ = (short)(uVar48 >> 0x10);
            auVar183._0_4_ = CONCAT22((short)uVar122,(short)uVar48);
            auVar183._4_12_ = auVar33;
            uVar48 = *(ulong *)((long)puVar52 + src_stride * 6);
            uVar122 = *(undefined8 *)((long)puVar52 + src_stride * 7);
            auVar196._8_4_ = 0;
            auVar196._0_8_ = uVar48;
            auVar196._12_2_ = (short)(uVar48 >> 0x30);
            auVar196._14_2_ = (short)((ulong)uVar122 >> 0x30);
            auVar195._12_4_ = auVar196._12_4_;
            auVar195._8_2_ = 0;
            auVar195._0_8_ = uVar48;
            auVar195._10_2_ = (short)((ulong)uVar122 >> 0x20);
            auVar194._10_6_ = auVar195._10_6_;
            auVar194._8_2_ = (short)(uVar48 >> 0x20);
            auVar194._0_8_ = uVar48;
            auVar34._4_8_ = auVar194._8_8_;
            auVar34._2_2_ = (short)((ulong)uVar122 >> 0x10);
            auVar34._0_2_ = (short)(uVar48 >> 0x10);
            auVar161._14_2_ = (short)uVar122;
            auVar161._12_2_ = (short)uVar48;
            auVar124._0_8_ = auVar73._0_8_;
            auVar124._8_4_ = auVar31._0_4_;
            auVar124._12_4_ = auVar32._0_4_;
            auVar161._0_4_ = auVar73._0_4_;
            auVar199._0_8_ = auVar183._0_8_;
            auVar199._8_4_ = auVar33._0_4_;
            auVar199._12_4_ = auVar34._0_4_;
            auVar161._8_4_ = auVar183._0_4_;
            auVar77._0_8_ = CONCAT44(auVar158._8_4_,auVar74._8_4_);
            auVar77._8_4_ = auVar75._12_4_;
            auVar77._12_4_ = auVar159._12_4_;
            auVar187._0_8_ = CONCAT44(auVar194._8_4_,auVar184._8_4_);
            auVar187._8_4_ = auVar185._12_4_;
            auVar187._12_4_ = auVar195._12_4_;
            auVar125._8_8_ = auVar199._8_8_;
            auVar125._0_8_ = auVar124._8_8_;
            auVar197._8_8_ = auVar187._0_8_;
            auVar197._0_8_ = auVar77._0_8_;
            auVar78._8_8_ = auVar187._8_8_;
            auVar78._0_8_ = auVar77._8_8_;
            auVar188 = pshufb(auVar101,_DAT_00514b60);
            auVar162 = pmaddubsw(auVar161,auVar188);
            auVar188 = pshufb(auVar101,_DAT_00514bb0);
            auVar188 = pmaddubsw(auVar125,auVar188);
            auVar189 = pshufb(auVar101,_DAT_00514b80);
            auVar189 = pmaddubsw(auVar197,auVar189);
            auVar198._0_2_ = auVar189._0_2_ + auVar162._0_2_ + 0x40;
            auVar198._2_2_ = auVar189._2_2_ + auVar162._2_2_ + 0x40;
            auVar198._4_2_ = auVar189._4_2_ + auVar162._4_2_ + 0x40;
            auVar198._6_2_ = auVar189._6_2_ + auVar162._6_2_ + 0x40;
            auVar198._8_2_ = auVar189._8_2_ + auVar162._8_2_ + 0x40;
            auVar198._10_2_ = auVar189._10_2_ + auVar162._10_2_ + 0x40;
            auVar198._12_2_ = auVar189._12_2_ + auVar162._12_2_ + 0x40;
            auVar198._14_2_ = auVar189._14_2_ + auVar162._14_2_ + 0x40;
            auVar101 = pshufb(auVar101,_DAT_00514bc0);
            auVar101 = pmaddubsw(auVar78,auVar101);
            auVar79._0_2_ = auVar101._0_2_ + auVar188._0_2_;
            auVar79._2_2_ = auVar101._2_2_ + auVar188._2_2_;
            auVar79._4_2_ = auVar101._4_2_ + auVar188._4_2_;
            auVar79._6_2_ = auVar101._6_2_ + auVar188._6_2_;
            auVar79._8_2_ = auVar101._8_2_ + auVar188._8_2_;
            auVar79._10_2_ = auVar101._10_2_ + auVar188._10_2_;
            auVar79._12_2_ = auVar101._12_2_ + auVar188._12_2_;
            auVar79._14_2_ = auVar101._14_2_ + auVar188._14_2_;
            auVar101 = paddsw(auVar79,auVar198);
            auVar101 = psraw(auVar101,7);
            sVar5 = auVar101._0_2_;
            sVar6 = auVar101._2_2_;
            sVar7 = auVar101._4_2_;
            sVar8 = auVar101._6_2_;
            sVar9 = auVar101._8_2_;
            sVar10 = auVar101._10_2_;
            sVar11 = auVar101._12_2_;
            sVar12 = auVar101._14_2_;
            (&local_2438)[lVar58] =
                 CONCAT17((0 < sVar12) * (sVar12 < 0x100) * auVar101[0xe] - (0xff < sVar12),
                          CONCAT16((0 < sVar11) * (sVar11 < 0x100) * auVar101[0xc] - (0xff < sVar11)
                                   ,CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar101[10] -
                                             (0xff < sVar10),
                                             CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar101[8] -
                                                      (0xff < sVar9),
                                                      CONCAT13((0 < sVar8) * (sVar8 < 0x100) *
                                                               auVar101[6] - (0xff < sVar8),
                                                               CONCAT12((0 < sVar7) *
                                                                        (sVar7 < 0x100) *
                                                                        auVar101[4] - (0xff < sVar7)
                                                                        ,CONCAT11((0 < sVar6) *
                                                                                  (sVar6 < 0x100) *
                                                                                  auVar101[2] -
                                                                                  (0xff < sVar6),
                                                                                  (0 < sVar5) *
                                                                                  (sVar5 < 0x100) *
                                                                                  auVar101[0] -
                                                                                  (0xff < sVar5)))))
                                            )));
          }
          uVar54 = uVar54 + x_step_q4;
          lVar58 = lVar58 + 1;
          puVar59 = puVar59 + 1;
        } while (lVar58 != 8);
        Var21 = CONCAT19(uStack_242f,CONCAT18(uStack_2430,local_2438));
        auVar22[10] = uStack_242e;
        auVar22._0_10_ = Var21;
        auVar23[0xb] = uStack_242d;
        auVar23._0_11_ = auVar22;
        auVar24[0xc] = uStack_242c;
        auVar24._0_12_ = auVar23;
        auVar87[0xd] = uStack_242b;
        auVar87._0_13_ = auVar24;
        auVar87[0xe] = (char)((ulong)local_2438 >> 0x38);
        auVar87[0xf] = uStack_2429;
        auVar86._14_2_ = auVar87._14_2_;
        auVar86[0xd] = uStack_242a;
        auVar86._0_13_ = auVar24;
        auVar85._13_3_ = auVar86._13_3_;
        auVar85[0xc] = (char)((ulong)local_2438 >> 0x30);
        auVar85._0_12_ = auVar23;
        auVar84._12_4_ = auVar85._12_4_;
        auVar84[0xb] = uStack_242b;
        auVar84._0_11_ = auVar22;
        auVar83._11_5_ = auVar84._11_5_;
        auVar83[10] = (char)((ulong)local_2438 >> 0x28);
        auVar83._0_10_ = Var21;
        auVar82._10_6_ = auVar83._10_6_;
        auVar82[9] = uStack_242c;
        auVar82._0_9_ = CONCAT18(uStack_2430,local_2438);
        auVar81._9_7_ = auVar82._9_7_;
        auVar81[8] = (char)((ulong)local_2438 >> 0x20);
        auVar81._0_8_ = local_2438;
        Var37 = CONCAT91(CONCAT81(auVar81._8_8_,uStack_242d),(char)((ulong)local_2438 >> 0x18));
        auVar36._2_10_ = Var37;
        auVar36[1] = uStack_242e;
        auVar36[0] = (char)((ulong)local_2438 >> 0x10);
        auVar35._2_12_ = auVar36;
        auVar35[1] = uStack_242f;
        auVar35[0] = (char)((ulong)local_2438 >> 8);
        auVar80._0_2_ = CONCAT11(uStack_2430,(char)local_2438);
        auVar80._2_14_ = auVar35;
        Var21 = CONCAT19(uStack_241f,CONCAT18(uStack_2420,local_2428));
        auVar25[10] = uStack_241e;
        auVar25._0_10_ = Var21;
        auVar26[0xb] = uStack_241d;
        auVar26._0_11_ = auVar25;
        auVar27[0xc] = uStack_241c;
        auVar27._0_12_ = auVar26;
        auVar108[0xd] = uStack_241b;
        auVar108._0_13_ = auVar27;
        auVar108[0xe] = (char)((ulong)local_2428 >> 0x38);
        auVar108[0xf] = uStack_2419;
        auVar107._14_2_ = auVar108._14_2_;
        auVar107[0xd] = uStack_241a;
        auVar107._0_13_ = auVar27;
        auVar106._13_3_ = auVar107._13_3_;
        auVar106[0xc] = (char)((ulong)local_2428 >> 0x30);
        auVar106._0_12_ = auVar26;
        auVar105._12_4_ = auVar106._12_4_;
        auVar105[0xb] = uStack_241b;
        auVar105._0_11_ = auVar25;
        auVar104._11_5_ = auVar105._11_5_;
        auVar104[10] = (char)((ulong)local_2428 >> 0x28);
        auVar104._0_10_ = Var21;
        auVar103._10_6_ = auVar104._10_6_;
        auVar103[9] = uStack_241c;
        auVar103._0_9_ = CONCAT18(uStack_2420,local_2428);
        auVar102._9_7_ = auVar103._9_7_;
        auVar102[8] = (char)((ulong)local_2428 >> 0x20);
        auVar102._0_8_ = local_2428;
        Var40 = CONCAT91(CONCAT81(auVar102._8_8_,uStack_241d),(char)((ulong)local_2428 >> 0x18));
        auVar39._2_10_ = Var40;
        auVar39[1] = uStack_241e;
        auVar39[0] = (char)((ulong)local_2428 >> 0x10);
        auVar38._2_12_ = auVar39;
        auVar38[1] = uStack_241f;
        auVar38[0] = (char)((ulong)local_2428 >> 8);
        Var21 = CONCAT19(uStack_240f,CONCAT18(uStack_2410,local_2418));
        auVar28[10] = uStack_240e;
        auVar28._0_10_ = Var21;
        auVar29[0xb] = uStack_240d;
        auVar29._0_11_ = auVar28;
        auVar30[0xc] = uStack_240c;
        auVar30._0_12_ = auVar29;
        auVar133[0xd] = uStack_240b;
        auVar133._0_13_ = auVar30;
        auVar133[0xe] = (char)((ulong)local_2418 >> 0x38);
        auVar133[0xf] = uStack_2409;
        auVar132._14_2_ = auVar133._14_2_;
        auVar132[0xd] = uStack_240a;
        auVar132._0_13_ = auVar30;
        auVar131._13_3_ = auVar132._13_3_;
        auVar131[0xc] = (char)((ulong)local_2418 >> 0x30);
        auVar131._0_12_ = auVar29;
        auVar130._12_4_ = auVar131._12_4_;
        auVar130[0xb] = uStack_240b;
        auVar130._0_11_ = auVar28;
        auVar129._11_5_ = auVar130._11_5_;
        auVar129[10] = (char)((ulong)local_2418 >> 0x28);
        auVar129._0_10_ = Var21;
        auVar128._10_6_ = auVar129._10_6_;
        auVar128[9] = uStack_240c;
        auVar128._0_9_ = CONCAT18(uStack_2410,local_2418);
        auVar127._9_7_ = auVar128._9_7_;
        auVar127[8] = (char)((ulong)local_2418 >> 0x20);
        auVar127._0_8_ = local_2418;
        Var21 = CONCAT91(CONCAT81(auVar127._8_8_,uStack_240d),(char)((ulong)local_2418 >> 0x18));
        auVar42._2_10_ = Var21;
        auVar42[1] = uStack_240e;
        auVar42[0] = (char)((ulong)local_2418 >> 0x10);
        auVar41._2_12_ = auVar42;
        auVar41[1] = uStack_240f;
        auVar41[0] = (char)((ulong)local_2418 >> 8);
        auVar126._0_2_ = CONCAT11(uStack_2410,(char)local_2418);
        auVar126._2_14_ = auVar41;
        auVar101 = pshufb(local_2408,_DAT_00514bd0);
        auVar192._0_12_ = auVar80._0_12_;
        auVar192._12_2_ = (short)Var37;
        auVar192._14_2_ = (short)Var40;
        auVar191._12_4_ = auVar192._12_4_;
        auVar191._0_10_ = auVar80._0_10_;
        auVar191._10_2_ = auVar39._0_2_;
        auVar190._10_6_ = auVar191._10_6_;
        auVar190._0_8_ = auVar80._0_8_;
        auVar190._8_2_ = auVar36._0_2_;
        auVar43._4_8_ = auVar190._8_8_;
        auVar43._2_2_ = auVar38._0_2_;
        auVar43._0_2_ = auVar35._0_2_;
        uVar71 = CONCAT22(auVar102._8_2_,auVar81._8_2_);
        auVar72._0_8_ = CONCAT26(auVar104._10_2_,CONCAT24(auVar83._10_2_,uVar71));
        auVar72._8_2_ = auVar85._12_2_;
        auVar72._10_2_ = auVar106._12_2_;
        auVar88._12_2_ = auVar86._14_2_;
        auVar88._0_12_ = auVar72;
        auVar88._14_2_ = auVar107._14_2_;
        auVar111._0_12_ = auVar126._0_12_;
        auVar111._12_2_ = (short)Var21;
        auVar111._14_2_ = auVar101._6_2_;
        auVar110._12_4_ = auVar111._12_4_;
        auVar110._0_10_ = auVar126._0_10_;
        auVar110._10_2_ = auVar101._4_2_;
        auVar109._10_6_ = auVar110._10_6_;
        auVar109._0_8_ = auVar126._0_8_;
        auVar109._8_2_ = auVar42._0_2_;
        auVar44._4_8_ = auVar109._8_8_;
        auVar44._2_2_ = auVar101._2_2_;
        auVar44._0_2_ = auVar41._0_2_;
        uVar121 = CONCAT22(auVar101._8_2_,auVar127._8_2_);
        auVar123._0_8_ = CONCAT26(auVar101._10_2_,CONCAT24(auVar129._10_2_,uVar121));
        auVar123._8_2_ = auVar131._12_2_;
        auVar123._10_2_ = auVar101._12_2_;
        auVar134._12_2_ = auVar132._14_2_;
        auVar134._0_12_ = auVar123;
        auVar134._14_2_ = auVar101._14_2_;
        *(ulong *)((long)puVar50 + uVar60) =
             CONCAT44(CONCAT22(auVar101._0_2_,auVar126._0_2_),
                      CONCAT22(CONCAT11(uStack_2420,(char)local_2428),auVar80._0_2_));
        *(ulong *)((long)puVar50 + uVar60 + 0x40) = CONCAT44(auVar44._0_4_,auVar43._0_4_);
        *(ulong *)((long)puVar50 + uVar60 + 0x80) = CONCAT44(auVar109._8_4_,auVar190._8_4_);
        uVar122 = CONCAT44(auVar110._12_4_,auVar191._12_4_);
        *(undefined8 *)((long)puVar50 + uVar60 + 0xc0) = uVar122;
        *(ulong *)((long)puVar50 + uVar60 + 0x100) = CONCAT44(uVar121,uVar71);
        *(ulong *)((long)puVar50 + uVar60 + 0x140) =
             CONCAT44((int)((ulong)auVar123._0_8_ >> 0x20),(int)((ulong)auVar72._0_8_ >> 0x20));
        *(ulong *)((long)puVar50 + uVar60 + 0x180) = CONCAT44(auVar123._8_4_,auVar72._8_4_);
        *(ulong *)((long)puVar50 + uVar60 + 0x1c0) = CONCAT44(auVar134._12_4_,auVar88._12_4_);
        uVar60 = uVar60 + 8;
      } while (uVar60 < (uint)w);
      puVar55 = puVar55 + src_stride * 8;
      puVar50 = puVar50 + 0x40;
      puVar51 = puVar51 + src_stride * 8;
      iVar47 = iVar47 + -8;
    } while (iVar47 != 0);
  }
  if (w < 0x10) {
    if (w == 8) {
      if (0 < h) {
        uVar60 = (ulong)(uint)h;
        do {
          lVar58 = (long)(y0_q4 >> 4);
          if ((y0_q4 & 0xfU) == 0) {
            *(undefined8 *)dst = (&uStack_2338)[lVar58 * 8];
          }
          else {
            auVar101 = *(undefined1 (*) [16])((long)*filter + (ulong)((y0_q4 & 0xfU) << 4));
            uVar48 = local_23f8[lVar58 * 8];
            uVar122 = (&uStack_23b8)[lVar58 * 8];
            auVar120._8_6_ = 0;
            auVar120._0_8_ = uVar48;
            auVar120[0xe] = (char)(uVar48 >> 0x38);
            auVar120[0xf] = (char)((ulong)uVar122 >> 0x38);
            auVar119._14_2_ = auVar120._14_2_;
            auVar119._8_5_ = 0;
            auVar119._0_8_ = uVar48;
            auVar119[0xd] = (char)((ulong)uVar122 >> 0x30);
            auVar118._13_3_ = auVar119._13_3_;
            auVar118._8_4_ = 0;
            auVar118._0_8_ = uVar48;
            auVar118[0xc] = (char)(uVar48 >> 0x30);
            auVar117._12_4_ = auVar118._12_4_;
            auVar117._8_3_ = 0;
            auVar117._0_8_ = uVar48;
            auVar117[0xb] = (char)((ulong)uVar122 >> 0x28);
            auVar116._11_5_ = auVar117._11_5_;
            auVar116._8_2_ = 0;
            auVar116._0_8_ = uVar48;
            auVar116[10] = (char)(uVar48 >> 0x28);
            auVar115._10_6_ = auVar116._10_6_;
            auVar115[8] = 0;
            auVar115._0_8_ = uVar48;
            auVar115[9] = (char)((ulong)uVar122 >> 0x20);
            auVar114._9_7_ = auVar115._9_7_;
            auVar114[8] = (char)(uVar48 >> 0x20);
            auVar114._0_8_ = uVar48;
            auVar113._8_8_ = auVar114._8_8_;
            auVar113[7] = (char)((ulong)uVar122 >> 0x18);
            auVar113[6] = (char)(uVar48 >> 0x18);
            auVar113[5] = (char)((ulong)uVar122 >> 0x10);
            auVar113[4] = (char)(uVar48 >> 0x10);
            auVar113[3] = (char)((ulong)uVar122 >> 8);
            auVar113[2] = (char)(uVar48 >> 8);
            auVar113[0] = (undefined1)uVar48;
            auVar113[1] = (char)uVar122;
            uVar48 = auStack_2378[lVar58 * 8];
            uVar122 = (&uStack_2338)[lVar58 * 8];
            auVar100._8_6_ = 0;
            auVar100._0_8_ = uVar48;
            auVar100[0xe] = (char)(uVar48 >> 0x38);
            auVar100[0xf] = (char)((ulong)uVar122 >> 0x38);
            auVar99._14_2_ = auVar100._14_2_;
            auVar99._8_5_ = 0;
            auVar99._0_8_ = uVar48;
            auVar99[0xd] = (char)((ulong)uVar122 >> 0x30);
            auVar98._13_3_ = auVar99._13_3_;
            auVar98._8_4_ = 0;
            auVar98._0_8_ = uVar48;
            auVar98[0xc] = (char)(uVar48 >> 0x30);
            auVar97._12_4_ = auVar98._12_4_;
            auVar97._8_3_ = 0;
            auVar97._0_8_ = uVar48;
            auVar97[0xb] = (char)((ulong)uVar122 >> 0x28);
            auVar96._11_5_ = auVar97._11_5_;
            auVar96._8_2_ = 0;
            auVar96._0_8_ = uVar48;
            auVar96[10] = (char)(uVar48 >> 0x28);
            auVar95._10_6_ = auVar96._10_6_;
            auVar95[8] = 0;
            auVar95._0_8_ = uVar48;
            auVar95[9] = (char)((ulong)uVar122 >> 0x20);
            auVar94._9_7_ = auVar95._9_7_;
            auVar94[8] = (char)(uVar48 >> 0x20);
            auVar94._0_8_ = uVar48;
            auVar93._8_8_ = auVar94._8_8_;
            auVar93[7] = (char)((ulong)uVar122 >> 0x18);
            auVar93[6] = (char)(uVar48 >> 0x18);
            auVar93[5] = (char)((ulong)uVar122 >> 0x10);
            auVar93[4] = (char)(uVar48 >> 0x10);
            auVar93[3] = (char)((ulong)uVar122 >> 8);
            auVar93[2] = (char)(uVar48 >> 8);
            auVar93[0] = (undefined1)uVar48;
            auVar93[1] = (char)uVar122;
            uVar48 = auStack_22f8[lVar58 * 8];
            uVar122 = (&uStack_22b8)[lVar58 * 8];
            auVar156._8_6_ = 0;
            auVar156._0_8_ = uVar48;
            auVar156[0xe] = (char)(uVar48 >> 0x38);
            auVar156[0xf] = (char)((ulong)uVar122 >> 0x38);
            auVar155._14_2_ = auVar156._14_2_;
            auVar155._8_5_ = 0;
            auVar155._0_8_ = uVar48;
            auVar155[0xd] = (char)((ulong)uVar122 >> 0x30);
            auVar154._13_3_ = auVar155._13_3_;
            auVar154._8_4_ = 0;
            auVar154._0_8_ = uVar48;
            auVar154[0xc] = (char)(uVar48 >> 0x30);
            auVar153._12_4_ = auVar154._12_4_;
            auVar153._8_3_ = 0;
            auVar153._0_8_ = uVar48;
            auVar153[0xb] = (char)((ulong)uVar122 >> 0x28);
            auVar152._11_5_ = auVar153._11_5_;
            auVar152._8_2_ = 0;
            auVar152._0_8_ = uVar48;
            auVar152[10] = (char)(uVar48 >> 0x28);
            auVar151._10_6_ = auVar152._10_6_;
            auVar151[8] = 0;
            auVar151._0_8_ = uVar48;
            auVar151[9] = (char)((ulong)uVar122 >> 0x20);
            auVar150._9_7_ = auVar151._9_7_;
            auVar150[8] = (char)(uVar48 >> 0x20);
            auVar150._0_8_ = uVar48;
            auVar149._8_8_ = auVar150._8_8_;
            auVar149[7] = (char)((ulong)uVar122 >> 0x18);
            auVar149[6] = (char)(uVar48 >> 0x18);
            auVar149[5] = (char)((ulong)uVar122 >> 0x10);
            auVar149[4] = (char)(uVar48 >> 0x10);
            auVar149[3] = (char)((ulong)uVar122 >> 8);
            auVar149[2] = (char)(uVar48 >> 8);
            auVar149[0] = (undefined1)uVar48;
            auVar149[1] = (char)uVar122;
            uVar48 = auStack_2278[lVar58 * 8];
            uVar122 = (&uStack_2238)[lVar58 * 8];
            auVar181._8_6_ = 0;
            auVar181._0_8_ = uVar48;
            auVar181[0xe] = (char)(uVar48 >> 0x38);
            auVar181[0xf] = (char)((ulong)uVar122 >> 0x38);
            auVar180._14_2_ = auVar181._14_2_;
            auVar180._8_5_ = 0;
            auVar180._0_8_ = uVar48;
            auVar180[0xd] = (char)((ulong)uVar122 >> 0x30);
            auVar179._13_3_ = auVar180._13_3_;
            auVar179._8_4_ = 0;
            auVar179._0_8_ = uVar48;
            auVar179[0xc] = (char)(uVar48 >> 0x30);
            auVar178._12_4_ = auVar179._12_4_;
            auVar178._8_3_ = 0;
            auVar178._0_8_ = uVar48;
            auVar178[0xb] = (char)((ulong)uVar122 >> 0x28);
            auVar177._11_5_ = auVar178._11_5_;
            auVar177._8_2_ = 0;
            auVar177._0_8_ = uVar48;
            auVar177[10] = (char)(uVar48 >> 0x28);
            auVar176._10_6_ = auVar177._10_6_;
            auVar176[8] = 0;
            auVar176._0_8_ = uVar48;
            auVar176[9] = (char)((ulong)uVar122 >> 0x20);
            auVar175._9_7_ = auVar176._9_7_;
            auVar175[8] = (char)(uVar48 >> 0x20);
            auVar175._0_8_ = uVar48;
            auVar174._8_8_ = auVar175._8_8_;
            auVar174[7] = (char)((ulong)uVar122 >> 0x18);
            auVar174[6] = (char)(uVar48 >> 0x18);
            auVar174[5] = (char)((ulong)uVar122 >> 0x10);
            auVar174[4] = (char)(uVar48 >> 0x10);
            auVar174[3] = (char)((ulong)uVar122 >> 8);
            auVar174[2] = (char)(uVar48 >> 8);
            auVar174[0] = (undefined1)uVar48;
            auVar174[1] = (char)uVar122;
            auVar188 = pshufb(auVar101,auVar61);
            auVar162 = pmaddubsw(auVar113,auVar188);
            auVar188 = pshufb(auVar101,auVar63);
            auVar188 = pmaddubsw(auVar93,auVar188);
            auVar189 = pshufb(auVar101,auVar62);
            auVar189 = pmaddubsw(auVar149,auVar189);
            auVar157._0_2_ = auVar189._0_2_ + auVar162._0_2_ + 0x40;
            auVar157._2_2_ = auVar189._2_2_ + auVar162._2_2_ + 0x40;
            auVar157._4_2_ = auVar189._4_2_ + auVar162._4_2_ + 0x40;
            auVar157._6_2_ = auVar189._6_2_ + auVar162._6_2_ + 0x40;
            auVar157._8_2_ = auVar189._8_2_ + auVar162._8_2_ + 0x40;
            auVar157._10_2_ = auVar189._10_2_ + auVar162._10_2_ + 0x40;
            auVar157._12_2_ = auVar189._12_2_ + auVar162._12_2_ + 0x40;
            auVar157._14_2_ = auVar189._14_2_ + auVar162._14_2_ + 0x40;
            auVar101 = pshufb(auVar101,auVar64);
            auVar101 = pmaddubsw(auVar174,auVar101);
            auVar182._0_2_ = auVar101._0_2_ + auVar188._0_2_;
            auVar182._2_2_ = auVar101._2_2_ + auVar188._2_2_;
            auVar182._4_2_ = auVar101._4_2_ + auVar188._4_2_;
            auVar182._6_2_ = auVar101._6_2_ + auVar188._6_2_;
            auVar182._8_2_ = auVar101._8_2_ + auVar188._8_2_;
            auVar182._10_2_ = auVar101._10_2_ + auVar188._10_2_;
            auVar182._12_2_ = auVar101._12_2_ + auVar188._12_2_;
            auVar182._14_2_ = auVar101._14_2_ + auVar188._14_2_;
            auVar101 = paddsw(auVar182,auVar157);
            auVar101 = psraw(auVar101,7);
            sVar5 = auVar101._0_2_;
            sVar6 = auVar101._2_2_;
            sVar7 = auVar101._4_2_;
            sVar8 = auVar101._6_2_;
            sVar9 = auVar101._8_2_;
            sVar10 = auVar101._10_2_;
            sVar11 = auVar101._12_2_;
            sVar12 = auVar101._14_2_;
            *(ulong *)dst =
                 CONCAT17((0 < sVar12) * (sVar12 < 0x100) * auVar101[0xe] - (0xff < sVar12),
                          CONCAT16((0 < sVar11) * (sVar11 < 0x100) * auVar101[0xc] - (0xff < sVar11)
                                   ,CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar101[10] -
                                             (0xff < sVar10),
                                             CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar101[8] -
                                                      (0xff < sVar9),
                                                      CONCAT13((0 < sVar8) * (sVar8 < 0x100) *
                                                               auVar101[6] - (0xff < sVar8),
                                                               CONCAT12((0 < sVar7) *
                                                                        (sVar7 < 0x100) *
                                                                        auVar101[4] - (0xff < sVar7)
                                                                        ,CONCAT11((0 < sVar6) *
                                                                                  (sVar6 < 0x100) *
                                                                                  auVar101[2] -
                                                                                  (0xff < sVar6),
                                                                                  (0 < sVar5) *
                                                                                  (sVar5 < 0x100) *
                                                                                  auVar101[0] -
                                                                                  (0xff < sVar5)))))
                                            )));
          }
          y0_q4 = y0_q4 + y_step_q4;
          dst = dst + dst_stride;
          uVar60 = uVar60 - 1;
        } while (uVar60 != 0);
      }
    }
    else if (0 < h) {
      uVar60 = (ulong)(uint)h;
      do {
        lVar58 = (long)(y0_q4 >> 4);
        if ((y0_q4 & 0xfU) == 0) {
          memcpy(dst,&uStack_2338 + lVar58 * 8,(long)w);
        }
        else {
          auVar61 = *(undefined1 (*) [16])((long)*filter + (ulong)((y0_q4 & 0xfU) << 4));
          uVar71 = (undefined4)local_23f8[lVar58 * 8];
          uVar121 = *(undefined4 *)(&uStack_23b8 + lVar58 * 8);
          auVar63._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11((char)((uint)uVar121 >> 0x18),
                                                (char)((uint)uVar71 >> 0x18)),
                                       (char)((uint)uVar121 >> 0x10)),
                              CONCAT14((char)((uint)uVar71 >> 0x10),uVar71)) >> 0x20);
          auVar63[3] = (char)((uint)uVar121 >> 8);
          auVar63[2] = (char)((uint)uVar71 >> 8);
          auVar63[0] = (undefined1)uVar71;
          auVar63[1] = (char)uVar121;
          auVar63._8_8_ = 0;
          uVar71 = (undefined4)auStack_2378[lVar58 * 8];
          uVar121 = *(undefined4 *)(&uStack_2338 + lVar58 * 8);
          auVar62._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11((char)((uint)uVar121 >> 0x18),
                                                (char)((uint)uVar71 >> 0x18)),
                                       (char)((uint)uVar121 >> 0x10)),
                              CONCAT14((char)((uint)uVar71 >> 0x10),uVar71)) >> 0x20);
          auVar62[3] = (char)((uint)uVar121 >> 8);
          auVar62[2] = (char)((uint)uVar71 >> 8);
          auVar62[0] = (undefined1)uVar71;
          auVar62[1] = (char)uVar121;
          auVar62._8_8_ = 0;
          uVar71 = (undefined4)auStack_22f8[lVar58 * 8];
          uVar121 = *(undefined4 *)(&uStack_22b8 + lVar58 * 8);
          auVar64._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11((char)((uint)uVar121 >> 0x18),
                                                (char)((uint)uVar71 >> 0x18)),
                                       (char)((uint)uVar121 >> 0x10)),
                              CONCAT14((char)((uint)uVar71 >> 0x10),uVar71)) >> 0x20);
          auVar64[3] = (char)((uint)uVar121 >> 8);
          auVar64[2] = (char)((uint)uVar71 >> 8);
          auVar64[0] = (undefined1)uVar71;
          auVar64[1] = (char)uVar121;
          auVar64._8_8_ = 0;
          uVar71 = (undefined4)auStack_2278[lVar58 * 8];
          uVar121 = *(undefined4 *)(&uStack_2238 + lVar58 * 8);
          auVar68._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11((char)((uint)uVar121 >> 0x18),
                                                (char)((uint)uVar71 >> 0x18)),
                                       (char)((uint)uVar121 >> 0x10)),
                              CONCAT14((char)((uint)uVar71 >> 0x10),uVar71)) >> 0x20);
          auVar68[3] = (char)((uint)uVar121 >> 8);
          auVar68[2] = (char)((uint)uVar71 >> 8);
          auVar68[0] = (undefined1)uVar71;
          auVar68[1] = (char)uVar121;
          auVar68._8_8_ = 0;
          auVar101 = pshufb(auVar61,_DAT_00514b60);
          auVar63 = pmaddubsw(auVar63,auVar101);
          auVar101 = pshufb(auVar61,_DAT_00514bb0);
          auVar62 = pmaddubsw(auVar62,auVar101);
          auVar101 = pshufb(auVar61,_DAT_00514b80);
          auVar64 = pmaddubsw(auVar64,auVar101);
          auVar65._0_2_ = auVar64._0_2_ + auVar63._0_2_ + 0x40;
          auVar65._2_2_ = auVar64._2_2_ + auVar63._2_2_ + 0x40;
          auVar65._4_2_ = auVar64._4_2_ + auVar63._4_2_ + 0x40;
          auVar65._6_2_ = auVar64._6_2_ + auVar63._6_2_ + 0x40;
          auVar65._8_2_ = auVar64._8_2_ + auVar63._8_2_ + 0x40;
          auVar65._10_2_ = auVar64._10_2_ + auVar63._10_2_ + 0x40;
          auVar65._12_2_ = auVar64._12_2_ + auVar63._12_2_ + 0x40;
          auVar65._14_2_ = auVar64._14_2_ + auVar63._14_2_ + 0x40;
          auVar61 = pshufb(auVar61,_DAT_00514bc0);
          auVar61 = pmaddubsw(auVar68,auVar61);
          auVar69._0_2_ = auVar61._0_2_ + auVar62._0_2_;
          auVar69._2_2_ = auVar61._2_2_ + auVar62._2_2_;
          auVar69._4_2_ = auVar61._4_2_ + auVar62._4_2_;
          auVar69._6_2_ = auVar61._6_2_ + auVar62._6_2_;
          auVar69._8_2_ = auVar61._8_2_ + auVar62._8_2_;
          auVar69._10_2_ = auVar61._10_2_ + auVar62._10_2_;
          auVar69._12_2_ = auVar61._12_2_ + auVar62._12_2_;
          auVar69._14_2_ = auVar61._14_2_ + auVar62._14_2_;
          auVar61 = paddsw(auVar69,auVar65);
          auVar61 = psraw(auVar61,7);
          sVar5 = auVar61._0_2_;
          sVar6 = auVar61._2_2_;
          sVar7 = auVar61._4_2_;
          sVar8 = auVar61._6_2_;
          *(uint *)dst = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar61[6] - (0xff < sVar8),
                                  CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar61[4] -
                                           (0xff < sVar7),
                                           CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar61[2] -
                                                    (0xff < sVar6),
                                                    (0 < sVar5) * (sVar5 < 0x100) * auVar61[0] -
                                                    (0xff < sVar5))));
        }
        y0_q4 = y0_q4 + y_step_q4;
        dst = dst + dst_stride;
        uVar60 = uVar60 - 1;
      } while (uVar60 != 0);
    }
  }
  else if (0 < h) {
    uVar60 = 0;
    puVar55 = dst;
    do {
      lVar58 = (long)(y0_q4 >> 4) * 0x40;
      if ((y0_q4 & 0xfU) == 0) {
        memcpy(dst + uVar60 * dst_stride,&uStack_2338 + (long)(y0_q4 >> 4) * 8,(ulong)(uint)w);
      }
      else {
        auVar61 = *(undefined1 (*) [16])((long)*filter + (ulong)((y0_q4 & 0xfU) << 4));
        auVar62 = pshufb(auVar61,_DAT_00514b60);
        auVar63 = pshufb(auVar61,_DAT_00514bb0);
        auVar64 = pshufb(auVar61,_DAT_00514b80);
        auVar61 = pshufb(auVar61,_DAT_00514bc0);
        uVar48 = 0;
        do {
          auVar101 = *(undefined1 (*) [16])((long)local_23f8 + uVar48 + lVar58);
          puVar1 = (undefined1 *)((long)&uStack_23b8 + uVar48 + lVar58);
          auVar188 = *(undefined1 (*) [16])((long)auStack_2378 + uVar48 + lVar58);
          puVar2 = (undefined1 *)((long)&uStack_2338 + uVar48 + lVar58);
          auVar162 = *(undefined1 (*) [16])((long)auStack_22f8 + uVar48 + lVar58);
          puVar3 = (undefined1 *)((long)&uStack_22b8 + uVar48 + lVar58);
          auVar189 = *(undefined1 (*) [16])((long)auStack_2278 + uVar48 + lVar58);
          puVar4 = (undefined1 *)((long)&uStack_2238 + uVar48 + lVar58);
          auVar207._0_14_ = auVar101._0_14_;
          auVar207[0xe] = auVar101[7];
          auVar207[0xf] = puVar1[7];
          auVar206._14_2_ = auVar207._14_2_;
          auVar206._0_13_ = auVar101._0_13_;
          auVar206[0xd] = puVar1[6];
          auVar205._13_3_ = auVar206._13_3_;
          auVar205._0_12_ = auVar101._0_12_;
          auVar205[0xc] = auVar101[6];
          auVar204._12_4_ = auVar205._12_4_;
          auVar204._0_11_ = auVar101._0_11_;
          auVar204[0xb] = puVar1[5];
          auVar203._11_5_ = auVar204._11_5_;
          auVar203._0_10_ = auVar101._0_10_;
          auVar203[10] = auVar101[5];
          auVar202._10_6_ = auVar203._10_6_;
          auVar202._0_9_ = auVar101._0_9_;
          auVar202[9] = puVar1[4];
          auVar201._9_7_ = auVar202._9_7_;
          auVar201._0_8_ = auVar101._0_8_;
          auVar201[8] = auVar101[4];
          auVar200._8_8_ = auVar201._8_8_;
          auVar200[7] = puVar1[3];
          auVar200[6] = auVar101[3];
          auVar200[5] = puVar1[2];
          auVar200[4] = auVar101[2];
          auVar200[3] = puVar1[1];
          auVar200[2] = auVar101[1];
          auVar200[0] = auVar101[0];
          auVar200[1] = *puVar1;
          auVar112[1] = puVar1[8];
          auVar112[0] = auVar101[8];
          auVar112[2] = auVar101[9];
          auVar112[3] = puVar1[9];
          auVar112[4] = auVar101[10];
          auVar112[5] = puVar1[10];
          auVar112[6] = auVar101[0xb];
          auVar112[7] = puVar1[0xb];
          auVar112[8] = auVar101[0xc];
          auVar112[9] = puVar1[0xc];
          auVar112[10] = auVar101[0xd];
          auVar112[0xb] = puVar1[0xd];
          auVar112[0xc] = auVar101[0xe];
          auVar112[0xd] = puVar1[0xe];
          auVar112[0xe] = auVar101[0xf];
          auVar112[0xf] = puVar1[0xf];
          auVar215._0_14_ = auVar188._0_14_;
          auVar215[0xe] = auVar188[7];
          auVar215[0xf] = puVar2[7];
          auVar214._14_2_ = auVar215._14_2_;
          auVar214._0_13_ = auVar188._0_13_;
          auVar214[0xd] = puVar2[6];
          auVar213._13_3_ = auVar214._13_3_;
          auVar213._0_12_ = auVar188._0_12_;
          auVar213[0xc] = auVar188[6];
          auVar212._12_4_ = auVar213._12_4_;
          auVar212._0_11_ = auVar188._0_11_;
          auVar212[0xb] = puVar2[5];
          auVar211._11_5_ = auVar212._11_5_;
          auVar211._0_10_ = auVar188._0_10_;
          auVar211[10] = auVar188[5];
          auVar210._10_6_ = auVar211._10_6_;
          auVar210._0_9_ = auVar188._0_9_;
          auVar210[9] = puVar2[4];
          auVar209._9_7_ = auVar210._9_7_;
          auVar209._0_8_ = auVar188._0_8_;
          auVar209[8] = auVar188[4];
          auVar208._8_8_ = auVar209._8_8_;
          auVar208[7] = puVar2[3];
          auVar208[6] = auVar188[3];
          auVar208[5] = puVar2[2];
          auVar208[4] = auVar188[2];
          auVar208[3] = puVar2[1];
          auVar208[2] = auVar188[1];
          auVar208[0] = auVar188[0];
          auVar208[1] = *puVar2;
          auVar70[1] = puVar2[8];
          auVar70[0] = auVar188[8];
          auVar70[2] = auVar188[9];
          auVar70[3] = puVar2[9];
          auVar70[4] = auVar188[10];
          auVar70[5] = puVar2[10];
          auVar70[6] = auVar188[0xb];
          auVar70[7] = puVar2[0xb];
          auVar70[8] = auVar188[0xc];
          auVar70[9] = puVar2[0xc];
          auVar70[10] = auVar188[0xd];
          auVar70[0xb] = puVar2[0xd];
          auVar70[0xc] = auVar188[0xe];
          auVar70[0xd] = puVar2[0xe];
          auVar70[0xe] = auVar188[0xf];
          auVar70[0xf] = puVar2[0xf];
          auVar146._0_14_ = auVar162._0_14_;
          auVar146[0xe] = auVar162[7];
          auVar146[0xf] = puVar3[7];
          auVar145._14_2_ = auVar146._14_2_;
          auVar145._0_13_ = auVar162._0_13_;
          auVar145[0xd] = puVar3[6];
          auVar144._13_3_ = auVar145._13_3_;
          auVar144._0_12_ = auVar162._0_12_;
          auVar144[0xc] = auVar162[6];
          auVar143._12_4_ = auVar144._12_4_;
          auVar143._0_11_ = auVar162._0_11_;
          auVar143[0xb] = puVar3[5];
          auVar142._11_5_ = auVar143._11_5_;
          auVar142._0_10_ = auVar162._0_10_;
          auVar142[10] = auVar162[5];
          auVar141._10_6_ = auVar142._10_6_;
          auVar141._0_9_ = auVar162._0_9_;
          auVar141[9] = puVar3[4];
          auVar140._9_7_ = auVar141._9_7_;
          auVar140._0_8_ = auVar162._0_8_;
          auVar140[8] = auVar162[4];
          auVar139._8_8_ = auVar140._8_8_;
          auVar139[7] = puVar3[3];
          auVar139[6] = auVar162[3];
          auVar139[5] = puVar3[2];
          auVar139[4] = auVar162[2];
          auVar139[3] = puVar3[1];
          auVar139[2] = auVar162[1];
          auVar139[0] = auVar162[0];
          auVar139[1] = *puVar3;
          auVar66[1] = puVar3[8];
          auVar66[0] = auVar162[8];
          auVar66[2] = auVar162[9];
          auVar66[3] = puVar3[9];
          auVar66[4] = auVar162[10];
          auVar66[5] = puVar3[10];
          auVar66[6] = auVar162[0xb];
          auVar66[7] = puVar3[0xb];
          auVar66[8] = auVar162[0xc];
          auVar66[9] = puVar3[0xc];
          auVar66[10] = auVar162[0xd];
          auVar66[0xb] = puVar3[0xd];
          auVar66[0xc] = auVar162[0xe];
          auVar66[0xd] = puVar3[0xe];
          auVar66[0xe] = auVar162[0xf];
          auVar66[0xf] = puVar3[0xf];
          auVar172._0_14_ = auVar189._0_14_;
          auVar172[0xe] = auVar189[7];
          auVar172[0xf] = puVar4[7];
          auVar171._14_2_ = auVar172._14_2_;
          auVar171._0_13_ = auVar189._0_13_;
          auVar171[0xd] = puVar4[6];
          auVar170._13_3_ = auVar171._13_3_;
          auVar170._0_12_ = auVar189._0_12_;
          auVar170[0xc] = auVar189[6];
          auVar169._12_4_ = auVar170._12_4_;
          auVar169._0_11_ = auVar189._0_11_;
          auVar169[0xb] = puVar4[5];
          auVar168._11_5_ = auVar169._11_5_;
          auVar168._0_10_ = auVar189._0_10_;
          auVar168[10] = auVar189[5];
          auVar167._10_6_ = auVar168._10_6_;
          auVar167._0_9_ = auVar189._0_9_;
          auVar167[9] = puVar4[4];
          auVar166._9_7_ = auVar167._9_7_;
          auVar166._0_8_ = auVar189._0_8_;
          auVar166[8] = auVar189[4];
          auVar165._8_8_ = auVar166._8_8_;
          auVar165[7] = puVar4[3];
          auVar165[6] = auVar189[3];
          auVar165[5] = puVar4[2];
          auVar165[4] = auVar189[2];
          auVar165[3] = puVar4[1];
          auVar165[2] = auVar189[1];
          auVar165[0] = auVar189[0];
          auVar165[1] = *puVar4;
          auVar91[1] = puVar4[8];
          auVar91[0] = auVar189[8];
          auVar91[2] = auVar189[9];
          auVar91[3] = puVar4[9];
          auVar91[4] = auVar189[10];
          auVar91[5] = puVar4[10];
          auVar91[6] = auVar189[0xb];
          auVar91[7] = puVar4[0xb];
          auVar91[8] = auVar189[0xc];
          auVar91[9] = puVar4[0xc];
          auVar91[10] = auVar189[0xd];
          auVar91[0xb] = puVar4[0xd];
          auVar91[0xc] = auVar189[0xe];
          auVar91[0xd] = puVar4[0xe];
          auVar91[0xe] = auVar189[0xf];
          auVar91[0xf] = puVar4[0xf];
          auVar162 = pmaddubsw(auVar200,auVar62);
          auVar189 = pmaddubsw(auVar208,auVar63);
          auVar101 = pmaddubsw(auVar139,auVar64);
          auVar188 = pmaddubsw(auVar165,auVar61);
          auVar173._0_2_ = auVar188._0_2_ + auVar189._0_2_;
          auVar173._2_2_ = auVar188._2_2_ + auVar189._2_2_;
          auVar173._4_2_ = auVar188._4_2_ + auVar189._4_2_;
          auVar173._6_2_ = auVar188._6_2_ + auVar189._6_2_;
          auVar173._8_2_ = auVar188._8_2_ + auVar189._8_2_;
          auVar173._10_2_ = auVar188._10_2_ + auVar189._10_2_;
          auVar173._12_2_ = auVar188._12_2_ + auVar189._12_2_;
          auVar173._14_2_ = auVar188._14_2_ + auVar189._14_2_;
          auVar147._0_2_ = auVar101._0_2_ + auVar162._0_2_ + 0x40;
          auVar147._2_2_ = auVar101._2_2_ + auVar162._2_2_ + 0x40;
          auVar147._4_2_ = auVar101._4_2_ + auVar162._4_2_ + 0x40;
          auVar147._6_2_ = auVar101._6_2_ + auVar162._6_2_ + 0x40;
          auVar147._8_2_ = auVar101._8_2_ + auVar162._8_2_ + 0x40;
          auVar147._10_2_ = auVar101._10_2_ + auVar162._10_2_ + 0x40;
          auVar147._12_2_ = auVar101._12_2_ + auVar162._12_2_ + 0x40;
          auVar147._14_2_ = auVar101._14_2_ + auVar162._14_2_ + 0x40;
          auVar101 = paddsw(auVar147,auVar173);
          auVar148 = psraw(auVar101,7);
          auVar189 = pmaddubsw(auVar112,auVar62);
          auVar188 = pmaddubsw(auVar70,auVar63);
          auVar101 = pmaddubsw(auVar66,auVar64);
          auVar162 = pmaddubsw(auVar91,auVar61);
          auVar92._0_2_ = auVar162._0_2_ + auVar188._0_2_;
          auVar92._2_2_ = auVar162._2_2_ + auVar188._2_2_;
          auVar92._4_2_ = auVar162._4_2_ + auVar188._4_2_;
          auVar92._6_2_ = auVar162._6_2_ + auVar188._6_2_;
          auVar92._8_2_ = auVar162._8_2_ + auVar188._8_2_;
          auVar92._10_2_ = auVar162._10_2_ + auVar188._10_2_;
          auVar92._12_2_ = auVar162._12_2_ + auVar188._12_2_;
          auVar92._14_2_ = auVar162._14_2_ + auVar188._14_2_;
          auVar67._0_2_ = auVar101._0_2_ + auVar189._0_2_ + 0x40;
          auVar67._2_2_ = auVar101._2_2_ + auVar189._2_2_ + 0x40;
          auVar67._4_2_ = auVar101._4_2_ + auVar189._4_2_ + 0x40;
          auVar67._6_2_ = auVar101._6_2_ + auVar189._6_2_ + 0x40;
          auVar67._8_2_ = auVar101._8_2_ + auVar189._8_2_ + 0x40;
          auVar67._10_2_ = auVar101._10_2_ + auVar189._10_2_ + 0x40;
          auVar67._12_2_ = auVar101._12_2_ + auVar189._12_2_ + 0x40;
          auVar67._14_2_ = auVar101._14_2_ + auVar189._14_2_ + 0x40;
          auVar101 = paddsw(auVar67,auVar92);
          auVar101 = psraw(auVar101,7);
          sVar5 = auVar148._0_2_;
          sVar6 = auVar148._2_2_;
          sVar7 = auVar148._4_2_;
          sVar8 = auVar148._6_2_;
          sVar9 = auVar148._8_2_;
          sVar10 = auVar148._10_2_;
          sVar11 = auVar148._12_2_;
          sVar12 = auVar148._14_2_;
          sVar13 = auVar101._0_2_;
          sVar14 = auVar101._2_2_;
          sVar15 = auVar101._4_2_;
          sVar16 = auVar101._6_2_;
          sVar17 = auVar101._8_2_;
          sVar18 = auVar101._10_2_;
          sVar19 = auVar101._12_2_;
          sVar20 = auVar101._14_2_;
          puVar51 = puVar55 + uVar48;
          *puVar51 = (0 < sVar5) * (sVar5 < 0x100) * auVar148[0] - (0xff < sVar5);
          puVar51[1] = (0 < sVar6) * (sVar6 < 0x100) * auVar148[2] - (0xff < sVar6);
          puVar51[2] = (0 < sVar7) * (sVar7 < 0x100) * auVar148[4] - (0xff < sVar7);
          puVar51[3] = (0 < sVar8) * (sVar8 < 0x100) * auVar148[6] - (0xff < sVar8);
          puVar51[4] = (0 < sVar9) * (sVar9 < 0x100) * auVar148[8] - (0xff < sVar9);
          puVar51[5] = (0 < sVar10) * (sVar10 < 0x100) * auVar148[10] - (0xff < sVar10);
          puVar51[6] = (0 < sVar11) * (sVar11 < 0x100) * auVar148[0xc] - (0xff < sVar11);
          puVar51[7] = (0 < sVar12) * (sVar12 < 0x100) * auVar148[0xe] - (0xff < sVar12);
          puVar51[8] = (0 < sVar13) * (sVar13 < 0x100) * auVar101[0] - (0xff < sVar13);
          puVar51[9] = (0 < sVar14) * (sVar14 < 0x100) * auVar101[2] - (0xff < sVar14);
          puVar51[10] = (0 < sVar15) * (sVar15 < 0x100) * auVar101[4] - (0xff < sVar15);
          puVar51[0xb] = (0 < sVar16) * (sVar16 < 0x100) * auVar101[6] - (0xff < sVar16);
          puVar51[0xc] = (0 < sVar17) * (sVar17 < 0x100) * auVar101[8] - (0xff < sVar17);
          puVar51[0xd] = (0 < sVar18) * (sVar18 < 0x100) * auVar101[10] - (0xff < sVar18);
          puVar51[0xe] = (0 < sVar19) * (sVar19 < 0x100) * auVar101[0xc] - (0xff < sVar19);
          puVar51[0xf] = (0 < sVar20) * (sVar20 < 0x100) * auVar101[0xe] - (0xff < sVar20);
          uVar48 = uVar48 + 0x10;
        } while (uVar48 < (uint)w);
      }
      y0_q4 = y0_q4 + y_step_q4;
      uVar60 = uVar60 + 1;
      puVar55 = puVar55 + dst_stride;
    } while (uVar60 != (uint)h);
  }
  return;
}

Assistant:

void aom_scaled_2d_ssse3(const uint8_t *src, ptrdiff_t src_stride, uint8_t *dst,
                         ptrdiff_t dst_stride, const InterpKernel *filter,
                         int x0_q4, int x_step_q4, int y0_q4, int y_step_q4,
                         int w, int h) {
  // Note: Fixed size intermediate buffer, temp, places limits on parameters.
  // 2d filtering proceeds in 2 steps:
  //   (1) Interpolate horizontally into an intermediate buffer, temp.
  //   (2) Interpolate temp vertically to derive the sub-pixel result.
  // Deriving the maximum number of rows in the temp buffer (135):
  // --Smallest scaling factor is x1/2 ==> y_step_q4 = 32 (Normative).
  // --Largest block size is 64x64 pixels.
  // --64 rows in the downscaled frame span a distance of (64 - 1) * 32 in the
  //   original frame (in 1/16th pixel units).
  // --Must round-up because block may be located at sub-pixel position.
  // --Require an additional SUBPEL_TAPS rows for the 8-tap filter tails.
  // --((64 - 1) * 32 + 15) >> 4 + 8 = 135.
  // --Require an additional 8 rows for the horiz_w8 transpose tail.
  // When calling in frame scaling function, the smallest scaling factor is x1/4
  // ==> y_step_q4 = 64. Since w and h are at most 16, the temp buffer is still
  // big enough.
  DECLARE_ALIGNED(16, uint8_t, temp[(135 + 8) * 64]);
  const int intermediate_height =
      (((h - 1) * y_step_q4 + y0_q4) >> SUBPEL_BITS) + SUBPEL_TAPS;

  assert(w <= 64);
  assert(h <= 64);
  assert(y_step_q4 <= 32 || (y_step_q4 <= 64 && h <= 32));
  assert(x_step_q4 <= 64);

  if (w >= 8) {
    scaledconvolve_horiz_w8(src - src_stride * (SUBPEL_TAPS / 2 - 1),
                            src_stride, temp, 64, filter, x0_q4, x_step_q4, w,
                            intermediate_height);
  } else {
    scaledconvolve_horiz_w4(src - src_stride * (SUBPEL_TAPS / 2 - 1),
                            src_stride, temp, 64, filter, x0_q4, x_step_q4, w,
                            intermediate_height);
  }

  if (w >= 16) {
    scaledconvolve_vert_w16(temp + 64 * (SUBPEL_TAPS / 2 - 1), 64, dst,
                            dst_stride, filter, y0_q4, y_step_q4, w, h);
  } else if (w == 8) {
    scaledconvolve_vert_w8(temp + 64 * (SUBPEL_TAPS / 2 - 1), 64, dst,
                           dst_stride, filter, y0_q4, y_step_q4, w, h);
  } else {
    scaledconvolve_vert_w4(temp + 64 * (SUBPEL_TAPS / 2 - 1), 64, dst,
                           dst_stride, filter, y0_q4, y_step_q4, w, h);
  }
}